

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall leveldb::Footer::EncodeTo(Footer *this,string *dst)

{
  long lVar1;
  long lVar2;
  size_t original_size;
  string *dst_local;
  Footer *this_local;
  
  lVar1 = std::__cxx11::string::size();
  BlockHandle::EncodeTo(&this->metaindex_handle_,dst);
  BlockHandle::EncodeTo(&this->index_handle_,dst);
  std::__cxx11::string::resize((ulong)dst);
  PutFixed32(dst,0x8b80fb57);
  PutFixed32(dst,0xdb477524);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == lVar1 + 0x30) {
    return;
  }
  __assert_fail("dst->size() == original_size + kEncodedLength",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/format.cc"
                ,0x26,"void leveldb::Footer::EncodeTo(std::string *) const");
}

Assistant:

void Footer::EncodeTo(std::string* dst) const {
  const size_t original_size = dst->size();
  metaindex_handle_.EncodeTo(dst);
  index_handle_.EncodeTo(dst);
  dst->resize(2 * BlockHandle::kMaxEncodedLength);  // Padding
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber & 0xffffffffu));
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber >> 32));
  assert(dst->size() == original_size + kEncodedLength);
  (void)original_size;  // Disable unused variable warning.
}